

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

Value * __thiscall
ot::commissioner::Interpreter::ProcessBorderAgent
          (Value *__return_storage_ptr__,Interpreter *this,Expression *aExpr)

{
  char cVar1;
  ErrorCode EVar2;
  bool bVar3;
  Value *pVVar4;
  pointer pbVar5;
  char *pcVar6;
  char *pcVar7;
  pointer pbVar8;
  ByteArray *aBytes;
  string *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string *psVar9;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  string netIf;
  uint64_t timeout;
  uint16_t locator;
  Value local_210;
  CommissionerAppPtr commissioner;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  undefined1 local_190 [40];
  undefined1 local_168 [40];
  undefined1 local_140 [40];
  undefined1 local_118 [40];
  BorderAgentHandler local_f0;
  undefined1 local_d0 [40];
  undefined1 local_a8 [40];
  undefined1 local_80 [40];
  undefined1 local_58 [40];
  
  (__return_storage_ptr__->mError).mCode = kNone;
  (__return_storage_ptr__->mError).mMessage._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mError).mMessage.field_2;
  (__return_storage_ptr__->mError).mMessage._M_string_length = 0;
  (__return_storage_ptr__->mError).mMessage.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->mData)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mData).field_2;
  (__return_storage_ptr__->mData)._M_string_length = 0;
  (__return_storage_ptr__->mData).field_2._M_local_buf[0] = '\0';
  pbVar8 = (aExpr->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(aExpr->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8) < 0x21) {
    netIf._M_dataplus._M_p = netIf._M_dataplus._M_p & 0xffffffff00000000;
    netIf._M_string_length = (size_type)anon_var_dwarf_29eef0;
    netIf.field_2._M_allocated_capacity = 0x11;
    netIf.field_2._8_8_ = 0;
    pcVar6 = "too few arguments";
    while (pcVar7 = pcVar6, pcVar7 != "") {
      pcVar6 = pcVar7 + 1;
      if (*pcVar7 == '}') {
        if ((pcVar6 == "") || (*pcVar6 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar6 = pcVar7 + 2;
      }
      else if (*pcVar7 == '{') {
        pcVar6 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar7,"",(format_string_checker<char> *)&netIf);
      }
    }
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&netIf;
    ::fmt::v10::vformat_abi_cxx11_
              ((string *)&timeout,(v10 *)"too few arguments",(string_view)ZEXT816(0x11),args);
    psVar9 = (string *)(local_58 + 8);
    local_58._0_4_ = kInvalidArgs;
    std::__cxx11::string::string(psVar9,(string *)&timeout);
    Value::Value(&local_210,(Error *)local_58);
LAB_001f715a:
    Value::operator=(__return_storage_ptr__,&local_210);
    Value::~Value(&local_210);
    std::__cxx11::string::~string(psVar9);
    this_00 = (string *)&timeout;
LAB_001f717f:
    std::__cxx11::string::~string((string *)this_00);
    return __return_storage_ptr__;
  }
  std::__cxx11::string::string((string *)&local_210,"discover",(allocator *)&netIf);
  bVar3 = CaseInsensitiveEqual(pbVar8 + 1,(string *)&local_210);
  std::__cxx11::string::~string((string *)&local_210);
  if (bVar3) {
    timeout = 4000;
    std::__cxx11::string::string((string *)&netIf,"",(allocator *)&local_210);
    pbVar8 = (aExpr->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pbVar5 = (aExpr->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (0x40 < (ulong)((long)pbVar5 - (long)pbVar8)) {
      utils::ParseInteger<unsigned_long>((Error *)local_118,&timeout,pbVar8 + 2);
      Value::Value(&local_210,(Error *)local_118);
      pVVar4 = Value::operator=(__return_storage_ptr__,&local_210);
      EVar2 = (pVVar4->mError).mCode;
      Value::~Value(&local_210);
      std::__cxx11::string::~string((string *)(local_118 + 8));
      this_00 = &netIf;
      if (EVar2 != kNone) goto LAB_001f717f;
      pbVar8 = (aExpr->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pbVar5 = (aExpr->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    }
    if ((long)pbVar5 - (long)pbVar8 == 0x80) {
      std::__cxx11::string::_M_assign((string *)&netIf);
    }
    local_f0.super__Function_base._M_functor._8_8_ = 0;
    local_f0.super__Function_base._M_functor._M_unused._M_object = BorderAgentHandler;
    local_f0._M_invoker =
         std::
         _Function_handler<void_(const_ot::commissioner::BorderAgent_*,_const_ot::commissioner::Error_&),_void_(*)(const_ot::commissioner::BorderAgent_*,_const_ot::commissioner::Error_&)>
         ::_M_invoke;
    local_f0.super__Function_base._M_manager =
         std::
         _Function_handler<void_(const_ot::commissioner::BorderAgent_*,_const_ot::commissioner::Error_&),_void_(*)(const_ot::commissioner::BorderAgent_*,_const_ot::commissioner::Error_&)>
         ::_M_manager;
    DiscoverBorderAgent((Error *)local_140,&local_f0,timeout,&netIf);
    Value::Value(&local_210,(Error *)local_140);
    Value::operator=(__return_storage_ptr__,&local_210);
    Value::~Value(&local_210);
    std::__cxx11::string::~string((string *)(local_140 + 8));
    std::_Function_base::~_Function_base(&local_f0.super__Function_base);
    this_00 = &netIf;
    goto LAB_001f717f;
  }
  pbVar8 = (aExpr->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::string((string *)&local_210,"get",(allocator *)&netIf);
  bVar3 = CaseInsensitiveEqual(pbVar8 + 1,(string *)&local_210);
  std::__cxx11::string::~string((string *)&local_210);
  if (!bVar3) {
    netIf._M_dataplus._M_p._0_4_ = 0xd;
    netIf._M_string_length = (size_type)anon_var_dwarf_2a45e3;
    netIf.field_2._M_allocated_capacity = 0x1f;
    netIf.field_2._8_8_ = 0x100000000;
    pcVar6 = "\'{}\' is not a valid sub-command";
    while (pcVar7 = pcVar6, pcVar7 != "") {
      pcVar6 = pcVar7 + 1;
      if (*pcVar7 == '}') {
        if ((pcVar6 == "") || (*pcVar6 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar6 = pcVar7 + 2;
      }
      else if (*pcVar7 == '{') {
        pcVar6 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                           (pcVar7,"",
                            (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&netIf);
      }
    }
    pbVar8 = (aExpr->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    netIf._M_dataplus._M_p = pbVar8[1]._M_dataplus._M_p;
    netIf._M_string_length = pbVar8[1]._M_string_length;
    fmt.size_ = 0xd;
    fmt.data_ = (char *)0x1f;
    args_00.field_1.args_ = in_R9.args_;
    args_00.desc_ = (unsigned_long_long)&netIf;
    ::fmt::v10::vformat_abi_cxx11_
              ((string *)&timeout,(v10 *)"\'{}\' is not a valid sub-command",fmt,args_00);
    psVar9 = (string *)(local_d0 + 8);
    local_d0._0_4_ = kInvalidCommand;
    std::__cxx11::string::string(psVar9,(string *)&timeout);
    Value::Value(&local_210,(Error *)local_d0);
    goto LAB_001f715a;
  }
  commissioner.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  commissioner.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  JobManager::GetSelectedCommissioner
            ((Error *)local_168,
             (this->mJobManager).
             super___shared_ptr<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             &commissioner);
  Value::Value(&local_210,(Error *)local_168);
  pVVar4 = Value::operator=(__return_storage_ptr__,&local_210);
  EVar2 = (pVVar4->mError).mCode;
  Value::~Value(&local_210);
  std::__cxx11::string::~string((string *)(local_168 + 8));
  if (EVar2 != kNone) goto LAB_001f7621;
  pbVar8 = (aExpr->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(aExpr->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8) < 0x41) {
    netIf._M_dataplus._M_p = netIf._M_dataplus._M_p & 0xffffffff00000000;
    netIf._M_string_length = (size_type)anon_var_dwarf_29eef0;
    netIf.field_2._M_allocated_capacity = 0x11;
    netIf.field_2._8_8_ = 0;
    pcVar6 = "too few arguments";
    while (pcVar7 = pcVar6, pcVar7 != "") {
      pcVar6 = pcVar7 + 1;
      if (*pcVar7 == '}') {
        if ((pcVar6 == "") || (*pcVar6 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar6 = pcVar7 + 2;
      }
      else if (*pcVar7 == '{') {
        pcVar6 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar7,"",(format_string_checker<char> *)&netIf);
      }
    }
    args_01.field_1.args_ = in_R9.args_;
    args_01.desc_ = (unsigned_long_long)&netIf;
    ::fmt::v10::vformat_abi_cxx11_
              ((string *)&timeout,(v10 *)"too few arguments",(string_view)ZEXT816(0x11),args_01);
    psVar9 = (string *)(local_80 + 8);
    local_80._0_4_ = kInvalidArgs;
    std::__cxx11::string::string(psVar9,(string *)&timeout);
    Value::Value(&local_210,(Error *)local_80);
LAB_001f75f7:
    Value::operator=(__return_storage_ptr__,&local_210);
    Value::~Value(&local_210);
    std::__cxx11::string::~string(psVar9);
    this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&timeout;
  }
  else {
    std::__cxx11::string::string((string *)&local_210,"locator",(allocator *)&netIf);
    bVar3 = CaseInsensitiveEqual(pbVar8 + 2,(string *)&local_210);
    std::__cxx11::string::~string((string *)&local_210);
    if (!bVar3) {
      netIf._M_dataplus._M_p._0_4_ = 0xd;
      netIf._M_string_length = (size_type)anon_var_dwarf_2a52ba;
      netIf.field_2._M_allocated_capacity = 0x24;
      netIf.field_2._8_8_ = 0x100000000;
      pcVar6 = "{} is not a valid border agent field";
      _locator = (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&netIf;
      while (pcVar6 != "") {
        cVar1 = *pcVar6;
        pcVar7 = pcVar6;
        while (cVar1 != '{') {
          pcVar7 = pcVar7 + 1;
          if (pcVar7 == "") {
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::writer::operator()((writer *)&locator,pcVar6,"");
            goto LAB_001f75a3;
          }
          cVar1 = *pcVar7;
        }
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::writer::operator()((writer *)&locator,pcVar6,pcVar7);
        pcVar6 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                           (pcVar7,"",
                            (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&netIf);
      }
LAB_001f75a3:
      pbVar8 = (aExpr->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      netIf._M_dataplus._M_p = pbVar8[2]._M_dataplus._M_p;
      netIf._M_string_length = pbVar8[2]._M_string_length;
      fmt_00.size_ = 0xd;
      fmt_00.data_ = (char *)0x24;
      args_02.field_1.args_ = in_R9.args_;
      args_02.desc_ = (unsigned_long_long)&netIf;
      ::fmt::v10::vformat_abi_cxx11_
                ((string *)&timeout,(v10 *)"{} is not a valid border agent field",fmt_00,args_02);
      psVar9 = (string *)(local_a8 + 8);
      local_a8._0_4_ = kInvalidArgs;
      std::__cxx11::string::string(psVar9,(string *)&timeout);
      Value::Value(&local_210,(Error *)local_a8);
      goto LAB_001f75f7;
    }
    (*((commissioner.
        super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      super_CommissionerHandler)._vptr_CommissionerHandler[0x13])
              (local_190,
               commissioner.
               super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,&locator);
    Value::Value(&local_210,(Error *)local_190);
    pVVar4 = Value::operator=(__return_storage_ptr__,&local_210);
    EVar2 = (pVVar4->mError).mCode;
    Value::~Value(&local_210);
    std::__cxx11::string::~string((string *)(local_190 + 8));
    if (EVar2 != kNone) goto LAB_001f7621;
    utils::Encode<unsigned_short>((ByteArray *)&timeout,locator);
    utils::Hex_abi_cxx11_(&netIf,(utils *)&timeout,aBytes);
    std::operator+(&local_1b0,"0x",&netIf);
    std::__cxx11::string::~string((string *)&netIf);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&timeout);
    Value::Value(&local_210,&local_1b0);
    Value::operator=(__return_storage_ptr__,&local_210);
    Value::~Value(&local_210);
    this_01 = &local_1b0;
  }
  std::__cxx11::string::~string((string *)this_01);
LAB_001f7621:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&commissioner.
              super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return __return_storage_ptr__;
}

Assistant:

Interpreter::Value Interpreter::ProcessBorderAgent(const Expression &aExpr)
{
    Value value;

    VerifyOrExit(aExpr.size() >= 2, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));

    if (CaseInsensitiveEqual(aExpr[1], "discover"))
    {
        uint64_t    timeout = 4000;
        std::string netIf   = "";

        if (aExpr.size() >= 3)
        {
            SuccessOrExit(value = ParseInteger(timeout, aExpr[2]));
        }

        if (aExpr.size() == 4)
        {
            netIf = aExpr[3];
        }

        SuccessOrExit(value = DiscoverBorderAgent(BorderAgentHandler, static_cast<size_t>(timeout), netIf));
    }
    else if (CaseInsensitiveEqual(aExpr[1], "get"))
    {
        CommissionerAppPtr commissioner = nullptr;

        SuccessOrExit(value = mJobManager->GetSelectedCommissioner(commissioner));
        VerifyOrExit(aExpr.size() >= 3, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));

        if (CaseInsensitiveEqual(aExpr[2], "locator"))
        {
            uint16_t locator;
            SuccessOrExit(value = commissioner->GetBorderAgentLocator(locator));
            value = ToHex(locator);
        }
        else
        {
            value = ERROR_INVALID_ARGS("{} is not a valid border agent field", aExpr[2]);
        }
    }
    else
    {
        value = ERROR_INVALID_COMMAND(SYNTAX_INVALID_SUBCOMMAND, aExpr[1]);
    }

exit:
    return value;
}